

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

int __thiscall ncnn::Yolov3DetectionOutput::load_param(Yolov3DetectionOutput *this,ParamDict *pd)

{
  void *pvVar1;
  Allocator *pAVar2;
  int iVar3;
  int *piVar4;
  float fVar5;
  Mat local_b8;
  Mat local_68;
  
  iVar3 = ParamDict::get(pd,0,0x14);
  this->num_class = iVar3;
  iVar3 = ParamDict::get(pd,1,5);
  this->num_box = iVar3;
  fVar5 = ParamDict::get(pd,2,0.01);
  this->confidence_threshold = fVar5;
  fVar5 = ParamDict::get(pd,3,0.45);
  this->nms_threshold = fVar5;
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b8,pd,4,&local_68);
  piVar4 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (&this->biases != &local_b8) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->biases).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->biases).data;
        pAVar2 = (this->biases).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->biases).data = local_b8.data;
    piVar4 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->biases).refcount = piVar4;
    (this->biases).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->biases).elempack = local_b8.elempack;
    (this->biases).allocator = local_b8.allocator;
    (this->biases).dims = local_b8.dims;
    (this->biases).w = local_b8.w;
    (this->biases).h = local_b8.h;
    (this->biases).d = local_b8.d;
    (this->biases).c = local_b8.c;
    (this->biases).cstep = local_b8.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  piVar4 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b8,pd,5,&local_68);
  piVar4 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (&this->mask != &local_b8) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->mask).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->mask).data;
        pAVar2 = (this->mask).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->mask).data = local_b8.data;
    piVar4 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->mask).refcount = piVar4;
    (this->mask).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->mask).elempack = local_b8.elempack;
    (this->mask).allocator = local_b8.allocator;
    (this->mask).dims = local_b8.dims;
    (this->mask).w = local_b8.w;
    (this->mask).h = local_b8.h;
    (this->mask).d = local_b8.d;
    (this->mask).c = local_b8.c;
    (this->mask).cstep = local_b8.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  piVar4 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b8,pd,6,&local_68);
  piVar4 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (&this->anchors_scale != &local_b8) {
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->anchors_scale).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar1 = (this->anchors_scale).data;
        pAVar2 = (this->anchors_scale).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (**(code **)(*(long *)pAVar2 + 0x18))();
        }
      }
    }
    (this->anchors_scale).data = local_b8.data;
    piVar4 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->anchors_scale).refcount = piVar4;
    (this->anchors_scale).elemsize = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
    ;
    (this->anchors_scale).elempack = local_b8.elempack;
    (this->anchors_scale).allocator = local_b8.allocator;
    (this->anchors_scale).dims = local_b8.dims;
    (this->anchors_scale).w = local_b8.w;
    (this->anchors_scale).h = local_b8.h;
    (this->anchors_scale).d = local_b8.d;
    (this->anchors_scale).c = local_b8.c;
    (this->anchors_scale).cstep = local_b8.cstep;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  piVar4 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (**(code **)(*(long *)local_68.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int Yolov3DetectionOutput::load_param(const ParamDict& pd)
{
    num_class = pd.get(0, 20);
    num_box = pd.get(1, 5);
    confidence_threshold = pd.get(2, 0.01f);
    nms_threshold = pd.get(3, 0.45f);
    biases = pd.get(4, Mat());
    mask = pd.get(5, Mat());
    anchors_scale = pd.get(6, Mat());
    return 0;
}